

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_test_class.cpp
# Opt level: O0

void __thiscall test_test::test_char_neq_compare::test_method(test_char_neq_compare *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_8f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_8e0;
  basic_cstring<const_char> local_8b8;
  basic_cstring<const_char> local_8a8;
  basic_cstring<const_char> local_898;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_888;
  basic_cstring<const_char> local_860;
  basic_cstring<const_char> local_850;
  basic_cstring<const_char> local_840;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_830;
  basic_cstring<const_char> local_808;
  basic_cstring<const_char> local_7f8;
  basic_cstring<const_char> local_7e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_7d8;
  basic_cstring<const_char> local_7b0;
  basic_cstring<const_char> local_7a0;
  basic_cstring<const_char> local_790;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_780;
  basic_cstring<const_char> local_758;
  basic_cstring<const_char> local_748;
  basic_cstring<const_char> local_738;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_728;
  basic_cstring<const_char> local_700;
  basic_cstring<const_char> local_6f0;
  basic_cstring<const_char> local_6e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_6d0;
  basic_cstring<const_char> local_6a8;
  basic_cstring<const_char> local_698;
  basic_cstring<const_char> local_688;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_678;
  basic_cstring<const_char> local_650;
  basic_cstring<const_char> local_640;
  basic_cstring<const_char> local_630;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_620;
  basic_cstring<const_char> local_5f8;
  basic_cstring<const_char> local_5e8;
  basic_cstring<const_char> local_5d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_5c8;
  basic_cstring<const_char> local_5a0;
  basic_cstring<const_char> local_590;
  basic_cstring<const_char> local_580;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_570;
  basic_cstring<const_char> local_548;
  basic_cstring<const_char> local_538;
  basic_cstring<const_char> local_528;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_518;
  basic_cstring<const_char> local_4f0;
  basic_cstring<const_char> local_4e0;
  basic_cstring<const_char> local_4d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_4c0;
  basic_cstring<const_char> local_498;
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_468;
  basic_cstring<const_char> local_440;
  basic_cstring<const_char> local_430;
  basic_cstring<const_char> local_420;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_410;
  basic_cstring<const_char> local_3e8;
  basic_cstring<const_char> local_3d8;
  basic_cstring<const_char> local_3c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3b8;
  basic_cstring<const_char> local_390;
  basic_cstring<const_char> local_380;
  basic_cstring<const_char> local_370;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_360;
  basic_cstring<const_char> local_338;
  basic_cstring<const_char> local_328;
  basic_cstring<const_char> local_318;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_308;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  basic_cstring<const_char> local_2c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2b0;
  basic_cstring<const_char> local_288;
  basic_cstring<const_char> local_278;
  basic_cstring<const_char> local_268;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_258;
  basic_cstring<const_char> local_230;
  basic_cstring<const_char> local_220;
  basic_cstring<const_char> local_210;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_200;
  basic_cstring<const_char> local_1d8;
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1a8;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170;
  basic_cstring<const_char> local_160;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_150;
  basic_cstring<const_char> local_128;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f8;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0 [2];
  basic_cstring<const_char> local_a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_90;
  basic_cstring<const_char> local_68;
  basic_cstring<const_char> local_58;
  char *local_48;
  char *rccpc4;
  char *lccpc4;
  char *rccp3;
  char *lccp3;
  char rcca2 [6];
  char lcca2 [6];
  char rca1 [6];
  char lca1 [6];
  test_char_neq_compare *this_local;
  
  stack0xffffffffffffffea = 0x6c6c6548;
  stack0xffffffffffffffe4 = 0x6c726f57;
  lcca2[2] = 'd';
  lcca2[3] = '\0';
  stack0xffffffffffffffde = 0x6c6c6548;
  rcca2[2] = 'o';
  rcca2[3] = '\0';
  lccp3._0_4_ = 0x6c726f57;
  lccp3._4_2_ = 100;
  rccp3 = "Hello";
  lccpc4 = "World";
  rccpc4 = "Hello";
  local_48 = "World";
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_68);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_58,0x6f,&local_68);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_90,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
              (&local_90,&local_a0,0x6f,1,3,"Hello","\"Hello\"","World","\"World\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_90);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,local_c0,0x70,&local_d0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f8,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
              (&local_f8,&local_108,0x70,1,3,"Hello","\"Hello\"",rcca2 + 4,"rca1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_128);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_118,0x71,&local_128);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_150,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
              (&local_150,&local_160,0x71,1,3,"Hello","\"Hello\"",&lccp3,"rcca2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_150);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_180);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_170,0x72,&local_180);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1a8,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
              (&local_1a8,&local_1b8,0x72,1,3,"Hello","\"Hello\"",&lccpc4,"rccp3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1c8,0x73,&local_1d8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_200,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
              (&local_200,&local_210,0x73,1,3,"Hello","\"Hello\"",&local_48,"rccpc4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_200);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_220,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_230);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_220,0x75,&local_230);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_258,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
              (&local_258,&local_268,0x75,1,3,lcca2 + 4,"lca1","World","\"World\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_258);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_288);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_278,0x76,&local_288);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2b0,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
              (&local_2b0,&local_2c0,0x76,1,3,lcca2 + 4,"lca1",rcca2 + 4,"rca1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2d0,0x77,&local_2e0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_308,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_318,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
              (&local_308,&local_318,0x77,1,3,lcca2 + 4,"lca1",&lccp3,"rcca2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_308);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_328,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_338);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_328,0x78,&local_338);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_360,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_370,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
              (&local_360,&local_370,0x78,1,3,lcca2 + 4,"lca1",&lccpc4,"rccp3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_360);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_380,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_390);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_380,0x79,&local_390);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3b8,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
              (&local_3b8,&local_3c8,0x79,1,3,lcca2 + 4,"lca1",&local_48,"rccpc4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_3d8,0x7b,&local_3e8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_410,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_420,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
              (&local_410,&local_420,0x7b,1,3,(long)&lccp3 + 6,"lcca2","World","\"World\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_410);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_430,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_440);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_430,0x7c,&local_440);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_468,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_478,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
              (&local_468,&local_478,0x7c,1,3,(long)&lccp3 + 6,"lcca2",rcca2 + 4,"rca1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_468);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_488,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_498);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_488,0x7d,&local_498);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4c0,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char[6]>
              (&local_4c0,&local_4d0,0x7d,1,3,(long)&lccp3 + 6,"lcca2",&lccp3,"rcca2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_4c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_4e0,0x7e,&local_4f0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_518,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_528,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
              (&local_518,&local_528,0x7e,1,3,(long)&lccp3 + 6,"lcca2",&lccpc4,"rccp3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_518);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_538,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_548);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_538,0x7f,&local_548);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_570,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_580,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char[6],char_const*>
              (&local_570,&local_580,0x7f,1,3,(long)&lccp3 + 6,"lcca2",&local_48,"rccpc4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_570);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_590,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_590,0x81,&local_5a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5c8,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
              (&local_5c8,&local_5d8,0x81,1,3,&rccp3,"lccp3","World","\"World\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_5c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_5e8,0x82,&local_5f8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_620,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_630,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
              (&local_620,&local_630,0x82,1,3,&rccp3,"lccp3",rcca2 + 4,"rca1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_620);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_640,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_650);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_640,0x83,&local_650);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_678,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_688,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
              (&local_678,&local_688,0x83,1,3,&rccp3,"lccp3",&lccp3,"rcca2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_678);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_698,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_698,0x84,&local_6a8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_6d0,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char_const*>
              (&local_6d0,&local_6e0,0x84,1,3,&rccp3,"lccp3",&lccpc4,"rccp3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_6d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_700);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_6f0,0x85,&local_700);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_728,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_738,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char_const*>
              (&local_728,&local_738,0x85,1,3,&rccp3,"lccp3",&local_48,"rccpc4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_728);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_748,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_758);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_748,0x87,&local_758);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_780,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_790,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
              (&local_780,&local_790,0x87,1,3,&rccpc4,"lccpc4","World","\"World\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_780);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_7a0,0x88,&local_7b0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_7d8,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
              (&local_7d8,&local_7e8,0x88,1,3,&rccpc4,"lccpc4",rcca2 + 4,"rca1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_7d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_808);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_7f8,0x89,&local_808);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_830,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_840,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char[6]>
              (&local_830,&local_840,0x89,1,3,&rccpc4,"lccpc4",&lccp3,"rcca2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_830);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_850,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_860);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_850,0x8a,&local_860);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_888,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_898,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char_const*>
              (&local_888,&local_898,0x8a,1,3,&rccpc4,"lccpc4",&lccpc4,"rccp3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_888);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_8a8,0x8b,&local_8b8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_8e0,plVar3,(char (*) [1])0x1beec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
               ,0x67);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,char_const*,char_const*>
              (&local_8e0,&local_8f0,0x8b,1,3,&rccpc4,"lccpc4",&local_48,"rccpc4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_8e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_char_neq_compare)
{
    char lca1[] = "Hello";
    char rca1[] = "World";
    const char lcca2[] = "Hello", rcca2[] = "World";
    const char *lccp3 = "Hello";
    const char *rccp3 = "World";
    const char * const lccpc4 = "Hello";
    const char * const rccpc4 = "World";

    BOOST_CHECK_NE("Hello", "World");
    BOOST_CHECK_NE("Hello", rca1);
    BOOST_CHECK_NE("Hello", rcca2);
    BOOST_CHECK_NE("Hello", rccp3);
    BOOST_CHECK_NE("Hello", rccpc4);

    BOOST_CHECK_NE(lca1, "World");
    BOOST_CHECK_NE(lca1, rca1);
    BOOST_CHECK_NE(lca1, rcca2);
    BOOST_CHECK_NE(lca1, rccp3);
    BOOST_CHECK_NE(lca1, rccpc4);

    BOOST_CHECK_NE(lcca2, "World");
    BOOST_CHECK_NE(lcca2, rca1);
    BOOST_CHECK_NE(lcca2, rcca2);
    BOOST_CHECK_NE(lcca2, rccp3);
    BOOST_CHECK_NE(lcca2, rccpc4);

    BOOST_CHECK_NE(lccp3, "World");
    BOOST_CHECK_NE(lccp3, rca1);
    BOOST_CHECK_NE(lccp3, rcca2);
    BOOST_CHECK_NE(lccp3, rccp3);
    BOOST_CHECK_NE(lccp3, rccpc4);

    BOOST_CHECK_NE(lccpc4, "World");
    BOOST_CHECK_NE(lccpc4, rca1);
    BOOST_CHECK_NE(lccpc4, rcca2);
    BOOST_CHECK_NE(lccpc4, rccp3);
    BOOST_CHECK_NE(lccpc4, rccpc4);
}